

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
HBF::heuristic_nhh_manhattan
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,HBF *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *grid,vector<int,_std::allocator<int>_> *goal)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pvVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  int iVar21;
  allocator_type local_52;
  allocator_type local_51;
  value_type_conflict1 local_50;
  vector<double,_std::allocator<double>_> local_48;
  long lVar19;
  
  pvVar1 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,
             (long)*(pointer *)
                    ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data + 8) -
             *(long *)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data >> 2,&local_50,&local_51);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555,&local_48
           ,&local_52);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  auVar11 = _DAT_00106120;
  auVar10 = _DAT_00106110;
  pvVar1 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(grid->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar12 != 0) {
    lVar12 = (lVar12 >> 3) * -0x5555555555555555;
    piVar3 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar4 = *(pointer *)
              ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data + 8);
    lVar13 = (long)piVar4 - (long)piVar3 >> 2;
    lVar13 = lVar13 + (ulong)(lVar13 == 0);
    pvVar5 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar14 = lVar13 + -1;
    auVar17._8_4_ = (int)lVar14;
    auVar17._0_8_ = lVar14;
    auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
    lVar14 = 0;
    auVar17 = auVar17 ^ _DAT_00106120;
    do {
      if (piVar4 != piVar3) {
        piVar6 = (goal->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar15 = (int)lVar14 - piVar6[1];
        iVar8 = -iVar15;
        if (0 < iVar15) {
          iVar8 = iVar15;
        }
        lVar7 = *(long *)&pvVar5[lVar14].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        iVar15 = -*piVar6;
        lVar16 = 1;
        auVar18 = auVar10;
        do {
          auVar20 = auVar18 ^ auVar11;
          iVar21 = iVar15 + 1 >> 0x1f;
          uVar9 = CONCAT44(iVar15 + 1,iVar15) ^ CONCAT44(iVar21,iVar15 >> 0x1f);
          if ((bool)(~(auVar20._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar20._0_4_ ||
                      auVar17._4_4_ < auVar20._4_4_) & 1)) {
            *(double *)(lVar7 + -8 + lVar16 * 8) = (double)(((int)uVar9 - (iVar15 >> 0x1f)) + iVar8)
            ;
          }
          if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
              auVar20._12_4_ <= auVar17._12_4_) {
            *(double *)(lVar7 + lVar16 * 8) = (double)(((int)(uVar9 >> 0x20) - iVar21) + iVar8);
          }
          lVar19 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 2;
          auVar18._8_8_ = lVar19 + 2;
          lVar19 = lVar16 - (lVar13 + 1U & 0xfffffffffffffffe);
          lVar16 = lVar16 + 2;
          iVar15 = iVar15 + 2;
        } while (lVar19 != -1);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar12 + (ulong)(lVar12 == 0));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<double> > HBF::heuristic_nhh_manhattan(vector<vector<int> > grid, vector<int> goal){
    /*
    Create the heuristic function for non-holonomic heuristic, which does not consider obstacles.
    A simple implementation that doesn't consider different trajectories at different points in cell.
    */

    vector<vector<double> > heuristic(grid.size(), vector<double>(grid[0].size(), 0));

    // give obstacles a very large value
    for (int i = 0; i < grid.size(); i ++){
        for (int j = 0; j < grid[0].size(); j ++){
            heuristic[i][j] = abs(i-goal[1])+abs(j-goal[0]);
        }
    }

    return heuristic;

}